

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

int64_t c_v256_dotp_s16(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ulong in_stack_00000020;
  
  auVar8._8_8_ = in_stack_00000020;
  auVar8._0_8_ = in_stack_00000018;
  uVar4 = in_stack_00000020 >> 0x10;
  uVar3 = a.u64[3] >> 0x10;
  auVar6._8_8_ = uVar4;
  auVar6._0_8_ = uVar4;
  auVar6._16_8_ = uVar4;
  auVar6._24_8_ = uVar4;
  auVar9._8_8_ = in_stack_00000008;
  auVar9._0_8_ = in_stack_00000008;
  auVar9._16_8_ = in_stack_00000008;
  auVar9._24_8_ = in_stack_00000008;
  auVar6 = vpunpcklqdq_avx2(auVar6,auVar9);
  auVar1 = vshufps_avx(auVar8,auVar6._16_16_,0x88);
  auVar7._8_8_ = uVar3;
  auVar7._0_8_ = uVar3;
  auVar7._16_8_ = uVar3;
  auVar7._24_8_ = uVar3;
  auVar10._8_8_ = a.u64[0];
  auVar10._0_8_ = a._0_8_;
  auVar10._16_8_ = a.u64[0];
  auVar10._24_8_ = a.u64[0];
  auVar6 = vpunpcklqdq_avx2(auVar7,auVar10);
  auVar8 = vpslld_avx(auVar1,0x10);
  auVar8 = vpinsrd_avx(auVar8,(int)(in_stack_00000020 >> 0x20),2);
  auVar8 = vpinsrd_avx(auVar8,(int)in_stack_00000008 << 0x10,3);
  auVar2 = vshufps_avx((undefined1  [16])a.v128[1],auVar6._16_16_,0x88);
  auVar5 = vpslld_avx(auVar2,0x10);
  auVar5 = vpinsrd_avx(auVar5,a.u32[7],2);
  auVar5 = vpinsrd_avx(auVar5,a.u32[0] << 0x10,3);
  auVar5 = vpsrld_avx(auVar5,0x10);
  auVar8 = vpsrld_avx(auVar8,0x10);
  auVar8 = vpblendw_avx(auVar8,auVar1,0xaa);
  auVar5 = vpblendw_avx(auVar5,auVar2,0xaa);
  auVar8 = vpmaddwd_avx(auVar5,auVar8);
  auVar6 = vpmovsxdq_avx2(auVar8);
  auVar8 = vpaddq_avx(auVar6._0_16_,auVar6._16_16_);
  auVar5 = vpshufd_avx(auVar8,0xee);
  auVar8 = vpaddq_avx(auVar8,auVar5);
  return auVar8._0_8_ +
         (long)((a.s64[0]._2_4_ >> 0x10) * ((int)((ulong)in_stack_00000008 >> 0x10) >> 0x10) +
               (a.s32[1] >> 0x10) * (int)((long)in_stack_00000008 >> 0x30)) +
         (long)((int)a.s16[4] * (int)(short)in_stack_00000010 +
               (a.s32[2] >> 0x10) * ((int)in_stack_00000010 >> 0x10)) +
         (long)((a.s64[2]._2_4_ >> 0x10) * ((int)((ulong)in_stack_00000018 >> 0x10) >> 0x10) +
               (a.s32[5] >> 0x10) * (int)((long)in_stack_00000018 >> 0x30)) +
         (long)((a.s64[1]._2_4_ >> 0x10) * ((int)((ulong)in_stack_00000010 >> 0x10) >> 0x10) +
               (a.s32[3] >> 0x10) * (int)((long)in_stack_00000010 >> 0x30));
}

Assistant:

SIMD_INLINE int64_t c_v256_dotp_s16(c_v256 a, c_v256 b) {
  return c_v128_dotp_s16(a.v128[1], b.v128[1]) +
         c_v128_dotp_s16(a.v128[0], b.v128[0]);
}